

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O3

int moebius(int n)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int local_c8 [2];
  int factor [20];
  int power [20];
  int local_20;
  int local_1c;
  int nleft;
  int nfactor;
  
  if (n < 1) {
    iVar4 = -1;
  }
  else {
    iVar4 = 1;
    if (n != 1) {
      i4_factor(n,0x14,&local_1c,local_c8,factor + 0x12,&local_20);
      if (local_20 != 1) {
        std::operator<<((ostream *)&std::cerr,"\n");
        std::operator<<((ostream *)&std::cerr,"MOEBIUS - Fatal error!\n");
        std::operator<<((ostream *)&std::cerr,"  Not enough factorization space.\n");
        exit(1);
      }
      if (0 < (long)local_1c) {
        lVar3 = 0;
        iVar1 = -1;
        iVar2 = 1;
        do {
          iVar4 = iVar1;
          if (1 < factor[lVar3 + 0x12]) {
            return 0;
          }
          lVar3 = lVar3 + 1;
          iVar1 = iVar2;
          iVar2 = iVar4;
        } while (local_1c != lVar3);
      }
    }
  }
  return iVar4;
}

Assistant:

int moebius ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    MOEBIUS returns the value of MU(N), the Moebius function of N.
//
//  Discussion:
//
//    MU(N) is defined as follows:
//
//      MU(N) = 1 if N = 1;
//              0 if N is divisible by the square of a prime;
//              (-1)^K, if N is the product of K distinct primes.
//
//    As special cases, MU(N) is -1 if N is a prime, and MU(N) is 0
//    if N is a square, cube, etc.
//
//    The Moebius function is related to Euler's totient function:
//
//      PHI(N) = Sum ( D divides N ) MU(D) * ( N / D ).
//
//  First values:
//
//     N  MU(N)
//
//     1    1
//     2   -1
//     3   -1
//     4    0
//     5   -1
//     6    1
//     7   -1
//     8    0
//     9    0
//    10    1
//    11   -1
//    12    0
//    13   -1
//    14    1
//    15    1
//    16    0
//    17   -1
//    18    0
//    19   -1
//    20    0
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    01 March 1999
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the value to be analyzed.
//
//    Output, int MOEBIUS, the value of MU(N).
//    If N is less than or equal to 0, or there was not enough internal 
//    space for factoring, MOEBIUS is returned as -1.
//
{
# define FACTOR_MAX 20

  int factor[FACTOR_MAX];
  int i;
  int nfactor;
  int nleft;
  int power[FACTOR_MAX];
  int value;

  if ( n <= 0 )
  {
    return (-1);
  }

  if ( n == 1 )
  {
    return 1;
  }
//
//  Factor N.
//
  i4_factor ( n, FACTOR_MAX, nfactor, factor, power, nleft );

  if ( nleft != 1 )
  {
    std::cerr << "\n";
    std::cerr << "MOEBIUS - Fatal error!\n";
    std::cerr <<  "  Not enough factorization space.\n";
    exit ( 1 );
  }

  value = 1;

  for ( i = 0; i < nfactor; i++ )
  {
    value = -value;

    if ( 1 < power[i] )
    {
      return 0;
    }

  }

  return value;
# undef FACTOR_MAX
}